

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool s2textformat::MakePoint(string_view str,S2Point *point)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  string_view str_00;
  undefined1 local_40 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Point *point_local;
  string_view str_local;
  
  str_00.ptr_ = (char *)str.length_;
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = point;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_40);
  str_00.length_ = (size_type)local_40;
  bVar1 = ParsePoints((s2textformat *)str.ptr_,str_00,in_RCX);
  if ((bVar1) &&
     (sVar2 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                        ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_40),
     sVar2 == 1)) {
    pvVar3 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                       ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_40,0);
    (vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->c_[0] = pvVar3->c_[0];
    (vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->c_[1] = pvVar3->c_[1];
    (vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->c_[2] = pvVar3->c_[2];
    str_local.length_._7_1_ = true;
  }
  else {
    str_local.length_._7_1_ = false;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_40);
  return str_local.length_._7_1_;
}

Assistant:

bool MakePoint(string_view str, S2Point* point) {
  vector<S2Point> vertices;
  if (!ParsePoints(str, &vertices) || vertices.size() != 1) return false;
  *point = vertices[0];
  return true;
}